

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_8_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  float *data;
  ulong uVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  int iVar51;
  float *pfVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  float *pfVar58;
  long lVar59;
  int k_count;
  int iVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  float *pfVar65;
  byte bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [12];
  undefined1 auVar105 [64];
  float fVar107;
  undefined1 auVar108 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  int data_width;
  float local_138;
  
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar105 = ZEXT1664(auVar74);
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar108 = ZEXT1664(auVar75);
  fVar81 = ipoint->scale;
  auVar111 = ZEXT464((uint)fVar81);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar81),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar81 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  iVar38 = (int)auVar67._0_4_;
  fVar79 = -0.08 / (fVar81 * fVar81);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar81;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  fVar3 = auVar72._0_4_ - auVar67._0_4_;
  auVar70 = ZEXT416((uint)fVar3);
  fVar4 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar81),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar81);
  if (iVar38 < (int)auVar67._0_4_) {
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (iVar38 < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + iVar38 <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar12,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + iVar38 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar52 = iimage->data;
          iVar1 = iimage->data_width;
          iVar36 = iVar38 * 2;
          pfVar65 = haarResponseY + 0x1f;
          pfVar58 = haarResponseX + 0x1f;
          uVar30 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar30;
            auVar67._4_12_ = in_ZMM8._4_12_;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)(fVar4 + 0.5)));
            iVar16 = (int)auVar67._0_4_;
            auVar93._0_4_ = (float)(int)(uVar30 | 1);
            auVar93._4_12_ = in_ZMM8._4_12_;
            auVar67 = vfmadd213ss_fma(auVar93,auVar68,ZEXT416((uint)(fVar4 + 0.5)));
            iVar21 = (int)auVar67._0_4_;
            iVar17 = (iVar16 + -1) * iVar1;
            iVar18 = (iVar16 + -1 + iVar38) * iVar1;
            iVar20 = (iVar16 + -1 + iVar36) * iVar1;
            iVar33 = (iVar21 + -1) * iVar1;
            iVar19 = (iVar21 + -1 + iVar38) * iVar1;
            iVar16 = (iVar21 + -1 + iVar36) * iVar1;
            lVar64 = 0;
            do {
              iVar21 = (int)lVar64;
              auVar94._0_4_ = (float)(iVar21 + -0xc);
              auVar94._4_12_ = in_ZMM8._4_12_;
              auVar67 = vfmadd213ss_fma(auVar94,auVar68,ZEXT416((uint)fVar3));
              iVar56 = (int)auVar67._0_4_;
              auVar95._0_4_ = (float)(iVar21 + -0xb);
              auVar95._4_12_ = in_ZMM8._4_12_;
              auVar67 = vfmadd213ss_fma(auVar95,auVar68,ZEXT416((uint)fVar3));
              iVar60 = (int)auVar67._0_4_;
              auVar96._0_4_ = (float)(iVar21 + -10);
              auVar106 = auVar108._4_12_;
              auVar96._4_12_ = auVar106;
              auVar70 = ZEXT416((uint)fVar3);
              auVar67 = vfmadd213ss_fma(auVar96,auVar68,auVar70);
              iVar34 = (int)auVar67._0_4_;
              auVar97._0_4_ = (float)(iVar21 + -9);
              auVar97._4_12_ = auVar106;
              auVar67 = vfmadd213ss_fma(auVar97,auVar68,auVar70);
              iVar22 = (int)auVar67._0_4_;
              auVar98._0_4_ = (float)(iVar21 + -8);
              auVar98._4_12_ = auVar106;
              auVar67 = vfmadd213ss_fma(auVar98,auVar68,auVar70);
              iVar23 = (int)auVar67._0_4_;
              auVar104._0_4_ = (float)(iVar21 + -7);
              auVar104._4_12_ = auVar106;
              auVar101._0_4_ = (float)(iVar21 + -6);
              auVar101._4_12_ = auVar106;
              auVar99._0_4_ = (float)(iVar21 + -5);
              auVar99._4_12_ = auVar106;
              iVar46 = iVar56 + -1 + iVar38;
              iVar48 = iVar56 + -1 + iVar36;
              fVar81 = pfVar52[iVar18 + -1 + iVar56];
              fVar80 = pfVar52[iVar20 + -1 + iVar56];
              fVar86 = pfVar52[iVar20 + iVar48];
              fVar90 = pfVar52[iVar17 + -1 + iVar56];
              fVar102 = pfVar52[iVar17 + iVar48];
              auVar69 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar46] -
                                                      pfVar52[iVar20 + iVar46])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar18 + iVar48];
              pfVar58[lVar64 + -0x1f] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -0x1f] = auVar67._0_4_ - (fVar80 - fVar102);
              iVar45 = iVar60 + -1 + iVar38;
              iVar57 = iVar60 + -1 + iVar36;
              fVar81 = pfVar52[iVar18 + -1 + iVar60];
              fVar80 = pfVar52[iVar20 + -1 + iVar60];
              fVar86 = pfVar52[iVar20 + iVar57];
              fVar90 = pfVar52[iVar17 + -1 + iVar60];
              fVar102 = pfVar52[iVar17 + iVar57];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar45] -
                                                      pfVar52[iVar20 + iVar45])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar18 + iVar57];
              pfVar58[lVar64 + -0x1e] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              iVar44 = iVar34 + -1 + iVar38;
              iVar51 = iVar34 + -1 + iVar36;
              pfVar65[lVar64 + -0x1e] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar18 + -1 + iVar34];
              fVar80 = pfVar52[iVar20 + -1 + iVar34];
              fVar86 = pfVar52[iVar20 + iVar51];
              fVar90 = pfVar52[iVar17 + -1 + iVar34];
              fVar102 = pfVar52[iVar17 + iVar51];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar44] -
                                                      pfVar52[iVar20 + iVar44])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar18 + iVar51];
              pfVar58[lVar64 + -0x1d] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -0x1d] = auVar67._0_4_ - (fVar80 - fVar102);
              iVar25 = iVar22 + -1 + iVar38;
              iVar43 = iVar22 + -1 + iVar36;
              fVar81 = pfVar52[iVar18 + -1 + iVar22];
              fVar80 = pfVar52[iVar20 + -1 + iVar22];
              fVar86 = pfVar52[iVar20 + iVar43];
              fVar90 = pfVar52[iVar17 + -1 + iVar22];
              fVar102 = pfVar52[iVar17 + iVar43];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar25] -
                                                      pfVar52[iVar20 + iVar25])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar18 + iVar43];
              pfVar58[lVar64 + -0x1c] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -0x1c] = auVar67._0_4_ - (fVar80 - fVar102);
              iVar40 = iVar23 + -1 + iVar38;
              fVar81 = pfVar52[iVar18 + -1 + iVar23];
              fVar80 = pfVar52[iVar20 + -1 + iVar23];
              iVar24 = iVar23 + -1 + iVar36;
              fVar86 = pfVar52[iVar20 + iVar24];
              fVar90 = pfVar52[iVar17 + -1 + iVar23];
              fVar102 = pfVar52[iVar17 + iVar24];
              fVar87 = pfVar52[iVar18 + iVar24];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar40] -
                                                      pfVar52[iVar20 + iVar40])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64 + -0x1b] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(auVar104,auVar68,auVar70);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              iVar41 = (int)auVar67._0_4_;
              pfVar65[lVar64 + -0x1b] = auVar70._0_4_ - (fVar80 - fVar102);
              iVar26 = iVar41 + -1 + iVar38;
              fVar81 = pfVar52[iVar18 + -1 + iVar41];
              fVar80 = pfVar52[iVar20 + -1 + iVar41];
              iVar29 = iVar41 + -1 + iVar36;
              fVar102 = pfVar52[iVar20 + iVar29] - pfVar52[iVar17 + -1 + iVar41];
              in_ZMM8 = ZEXT464((uint)fVar102);
              fVar86 = pfVar52[iVar17 + iVar29];
              fVar90 = pfVar52[iVar18 + iVar29];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar26] -
                                                      pfVar52[iVar20 + iVar26])),auVar69,
                                        ZEXT416((uint)fVar102));
              pfVar58[lVar64 + -0x1a] = (fVar80 - fVar86) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(auVar101,auVar68,ZEXT416((uint)fVar3));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar90)),auVar69,
                                        ZEXT416((uint)fVar102));
              iVar42 = (int)auVar67._0_4_;
              iVar27 = iVar42 + -1 + iVar38;
              pfVar65[lVar64 + -0x1a] = auVar70._0_4_ - (fVar80 - fVar86);
              fVar81 = pfVar52[iVar18 + -1 + iVar42];
              fVar80 = pfVar52[iVar20 + -1 + iVar42];
              iVar49 = iVar42 + -1 + iVar36;
              fVar102 = pfVar52[iVar20 + iVar49] - pfVar52[iVar17 + -1 + iVar42];
              auVar108 = ZEXT464((uint)fVar102);
              fVar86 = pfVar52[iVar17 + iVar49];
              fVar90 = pfVar52[iVar18 + iVar49];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar27] -
                                                      pfVar52[iVar20 + iVar27])),auVar69,
                                        ZEXT416((uint)fVar102));
              pfVar58[lVar64 + -0x19] = (fVar80 - fVar86) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(auVar99,auVar68,ZEXT416((uint)fVar3));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar90)),auVar69,
                                        ZEXT416((uint)fVar102));
              pfVar65[lVar64 + -0x19] = auVar70._0_4_ - (fVar80 - fVar86);
              iVar62 = (int)auVar67._0_4_;
              iVar28 = iVar62 + -1 + iVar38;
              fVar81 = pfVar52[iVar18 + -1 + iVar62];
              fVar80 = pfVar52[iVar20 + -1 + iVar62];
              iVar55 = iVar62 + -1 + iVar36;
              fVar86 = pfVar52[iVar20 + iVar55];
              fVar90 = pfVar52[iVar17 + -1 + iVar62];
              fVar102 = pfVar52[iVar17 + iVar55];
              fVar87 = pfVar52[iVar18 + iVar55];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar17 + iVar28] -
                                                      pfVar52[iVar20 + iVar28])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64 + -0x18] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -0x18] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar56];
              fVar80 = pfVar52[iVar16 + -1 + iVar56];
              fVar86 = pfVar52[iVar48 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar56];
              fVar102 = pfVar52[iVar33 + iVar48];
              fVar87 = pfVar52[iVar19 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar46] -
                                                      pfVar52[iVar46 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64 + -7] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -7] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar60];
              fVar80 = pfVar52[iVar16 + -1 + iVar60];
              fVar86 = pfVar52[iVar57 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar60];
              fVar102 = pfVar52[iVar33 + iVar57];
              fVar87 = pfVar52[iVar19 + iVar57];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar45] -
                                                      pfVar52[iVar45 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64 + -6] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -6] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar34];
              fVar80 = pfVar52[iVar16 + -1 + iVar34];
              fVar86 = pfVar52[iVar51 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar34];
              fVar102 = pfVar52[iVar33 + iVar51];
              fVar87 = pfVar52[iVar19 + iVar51];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar44] -
                                                      pfVar52[iVar44 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64 + -5] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -5] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar22];
              fVar80 = pfVar52[iVar16 + -1 + iVar22];
              fVar86 = pfVar52[iVar43 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar22];
              fVar102 = pfVar52[iVar33 + iVar43];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar25] -
                                                      pfVar52[iVar25 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar19 + iVar43];
              pfVar58[lVar64 + -4] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -4] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar23];
              fVar80 = pfVar52[iVar16 + -1 + iVar23];
              fVar86 = pfVar52[iVar24 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar23];
              fVar102 = pfVar52[iVar33 + iVar24];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar40] -
                                                      pfVar52[iVar40 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar19 + iVar24];
              pfVar58[lVar64 + -3] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -3] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar41];
              fVar80 = pfVar52[iVar16 + -1 + iVar41];
              fVar86 = pfVar52[iVar29 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar41];
              fVar102 = pfVar52[iVar33 + iVar29];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar26] -
                                                      pfVar52[iVar26 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar19 + iVar29];
              pfVar58[lVar64 + -2] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -2] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar42];
              fVar80 = pfVar52[iVar16 + -1 + iVar42];
              fVar86 = pfVar52[iVar49 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar42];
              fVar102 = pfVar52[iVar33 + iVar49];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar27] -
                                                      pfVar52[iVar27 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              fVar87 = pfVar52[iVar19 + iVar49];
              pfVar58[lVar64 + -1] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64 + -1] = auVar67._0_4_ - (fVar80 - fVar102);
              fVar81 = pfVar52[iVar19 + -1 + iVar62];
              fVar80 = pfVar52[iVar16 + -1 + iVar62];
              fVar86 = pfVar52[iVar55 + iVar16];
              fVar90 = pfVar52[iVar33 + -1 + iVar62];
              fVar102 = pfVar52[iVar33 + iVar55];
              fVar87 = pfVar52[iVar19 + iVar55];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar33 + iVar28] -
                                                      pfVar52[iVar28 + iVar16])),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar58[lVar64] = (fVar80 - fVar102) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar87)),auVar69,
                                        ZEXT416((uint)(fVar86 - fVar90)));
              pfVar65[lVar64] = auVar67._0_4_ - (fVar80 - fVar102);
              lVar64 = lVar64 + 8;
            } while (iVar21 + -0xc < 4);
            pfVar65 = pfVar65 + 0x30;
            pfVar58 = pfVar58 + 0x30;
            bVar2 = (int)uVar30 < 10;
            uVar30 = uVar30 + 2;
          } while (bVar2);
          goto LAB_001c93d7;
        }
      }
    }
  }
  iVar1 = iVar38 * 2;
  lVar64 = 0;
  uVar30 = 0xfffffff4;
  do {
    auVar82._0_4_ = (float)(int)uVar30;
    auVar82._4_12_ = in_ZMM8._4_12_;
    auVar67 = vfmadd213ss_fma(auVar82,auVar111._0_16_,ZEXT416((uint)fVar4));
    auVar84._0_4_ = (float)(int)(uVar30 | 1);
    auVar84._4_12_ = in_ZMM8._4_12_;
    auVar69 = vfmadd213ss_fma(auVar84,auVar111._0_16_,ZEXT416((uint)fVar4));
    fVar80 = auVar67._0_4_;
    iVar33 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
    fVar80 = auVar69._0_4_;
    iVar60 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
    iVar16 = iVar1 + iVar33;
    iVar17 = iVar33 + -1;
    iVar18 = iVar33 + -1 + iVar38;
    iVar19 = iVar1 + iVar60;
    iVar20 = iVar60 + -1;
    iVar21 = iVar60 + -1 + iVar38;
    lVar63 = lVar64;
    iVar36 = -0xc;
    do {
      auVar83._0_4_ = (float)iVar36;
      auVar106 = auVar105._4_12_;
      auVar83._4_12_ = auVar106;
      auVar71 = auVar111._0_16_;
      auVar67 = vfmadd213ss_fma(auVar83,auVar71,auVar70);
      auVar103._0_4_ = (float)(iVar36 + 1);
      auVar103._4_12_ = auVar106;
      auVar69 = vfmadd213ss_fma(auVar103,auVar71,auVar70);
      fVar102 = auVar69._0_4_;
      auVar91._0_4_ = (float)(iVar36 + 2);
      auVar91._4_12_ = auVar106;
      auVar69 = vfmadd213ss_fma(auVar91,auVar71,auVar70);
      auVar88._0_4_ = (float)(iVar36 + 3);
      auVar88._4_12_ = auVar106;
      auVar71 = vfmadd213ss_fma(auVar88,auVar71,auVar70);
      fVar80 = auVar67._0_4_;
      fVar90 = auVar69._0_4_;
      fVar86 = auVar71._0_4_;
      pfVar52 = (float *)((long)haarResponseY + lVar63);
      iVar34 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
      if ((((iVar33 < 1) || (iVar34 < 1)) || (iimage->height < iVar16)) ||
         (iVar22 = iVar1 + iVar34, iimage->width < iVar22)) {
        haarXY(iimage,iVar33,iVar34,iVar38,(float *)((long)haarResponseX + lVar63),pfVar52);
      }
      else {
        iVar25 = iVar34 + -1 + iVar38;
        pfVar65 = iimage->data;
        iVar23 = iimage->data_width;
        iVar24 = iVar23 * iVar17;
        fVar80 = pfVar65[iVar23 * iVar18 + -1 + iVar34];
        iVar26 = iVar23 * (iVar1 + -1 + iVar33);
        fVar87 = pfVar65[iVar26 + -1 + iVar34];
        fVar5 = pfVar65[iVar26 + -1 + iVar22];
        fVar6 = pfVar65[iVar24 + -1 + iVar34];
        fVar7 = pfVar65[iVar24 + -1 + iVar22];
        fVar8 = pfVar65[iVar23 * iVar18 + -1 + iVar22];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar24 + iVar25] - pfVar65[iVar26 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *(float *)((long)haarResponseX + lVar63) = (fVar87 - fVar7) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar52 = auVar67._0_4_ - (fVar87 - fVar7);
      }
      iVar22 = (int)((double)((ulong)(0.0 <= fVar102) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar102) * -0x4020000000000000) + (double)fVar102);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 4);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 4);
      if (((iVar33 < 1) || (iVar22 < 1)) ||
         ((iimage->height < iVar16 || (iVar23 = iVar1 + iVar22, iimage->width < iVar23)))) {
        haarXY(iimage,iVar33,iVar22,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar26 = iVar22 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar24 = iimage->data_width;
        iVar25 = iVar24 * iVar17;
        fVar80 = pfVar58[iVar24 * iVar18 + -1 + iVar22];
        iVar27 = iVar24 * (iVar1 + -1 + iVar33);
        fVar102 = pfVar58[iVar27 + -1 + iVar22];
        fVar87 = pfVar58[iVar27 + -1 + iVar23];
        fVar5 = pfVar58[iVar25 + -1 + iVar22];
        fVar6 = pfVar58[iVar25 + -1 + iVar23];
        fVar7 = pfVar58[iVar24 * iVar18 + -1 + iVar23];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar25 + iVar26] - pfVar58[iVar27 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar87 - fVar5)));
        *pfVar52 = (fVar102 - fVar6) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar87 - fVar5)));
        *pfVar65 = auVar67._0_4_ - (fVar102 - fVar6);
      }
      iVar23 = (int)((double)((ulong)(0.0 <= fVar90) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar90) * -0x4020000000000000) + (double)fVar90);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 8);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 8);
      if (((iVar33 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar16 || (iVar24 = iVar1 + iVar23, iimage->width < iVar24)))) {
        haarXY(iimage,iVar33,iVar23,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar27 = iVar23 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar25 = iimage->data_width;
        iVar26 = iVar25 * iVar17;
        fVar80 = pfVar58[iVar25 * iVar18 + -1 + iVar23];
        iVar28 = iVar25 * (iVar1 + -1 + iVar33);
        fVar90 = pfVar58[iVar28 + -1 + iVar23];
        fVar102 = pfVar58[iVar28 + -1 + iVar24];
        fVar87 = pfVar58[iVar26 + -1 + iVar23];
        fVar5 = pfVar58[iVar26 + -1 + iVar24];
        fVar6 = pfVar58[iVar25 * iVar18 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar26 + iVar27] - pfVar58[iVar28 + iVar27]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar102 - fVar87)));
        *pfVar52 = (fVar90 - fVar5) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar102 - fVar87)));
        *pfVar65 = auVar67._0_4_ - (fVar90 - fVar5);
      }
      iVar24 = (int)((double)((ulong)(0.0 <= fVar86) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar86) * -0x4020000000000000) + (double)fVar86);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0xc);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0xc);
      if ((((iVar33 < 1) || (iVar24 < 1)) || (iimage->height < iVar16)) ||
         (iVar25 = iVar1 + iVar24, iimage->width < iVar25)) {
        haarXY(iimage,iVar33,iVar24,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar28 = iVar24 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar26 = iimage->data_width;
        iVar27 = iVar26 * iVar17;
        fVar80 = pfVar58[iVar26 * iVar18 + -1 + iVar24];
        iVar29 = iVar26 * (iVar1 + -1 + iVar33);
        fVar86 = pfVar58[iVar29 + -1 + iVar24];
        fVar90 = pfVar58[iVar29 + -1 + iVar25];
        fVar102 = pfVar58[iVar27 + -1 + iVar24];
        fVar87 = pfVar58[iVar27 + -1 + iVar25];
        fVar5 = pfVar58[iVar26 * iVar18 + -1 + iVar25];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar27 + iVar28] - pfVar58[iVar29 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      auVar67 = vpbroadcastd_avx512vl();
      auVar67 = vpaddd_avx(auVar67,_DAT_005766f0);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar15._4_4_ = fVar81;
      auVar15._0_4_ = fVar81;
      auVar15._8_4_ = fVar81;
      auVar15._12_4_ = fVar81;
      auVar69 = vfmadd132ps_fma(auVar67,auVar14,auVar15);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      uVar31 = vcmpps_avx512vl(auVar69,_DAT_00576190,0xd);
      bVar66 = (byte)(uVar31 >> 3);
      iVar25 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x10);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x10);
      if (((iVar33 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar16 || (iVar26 = iVar1 + iVar25, iimage->width < iVar26)))) {
        haarXY(iimage,iVar33,iVar25,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar29 = iVar25 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar27 = iimage->data_width;
        iVar28 = iVar27 * iVar17;
        fVar80 = pfVar58[iVar27 * iVar18 + -1 + iVar25];
        iVar46 = iVar27 * (iVar1 + -1 + iVar33);
        fVar86 = pfVar58[iVar46 + -1 + iVar25];
        fVar90 = pfVar58[iVar46 + -1 + iVar26];
        fVar102 = pfVar58[iVar28 + -1 + iVar25];
        fVar87 = pfVar58[iVar28 + -1 + iVar26];
        fVar5 = pfVar58[iVar27 * iVar18 + -1 + iVar26];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar28 + iVar29] - pfVar58[iVar46 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      bVar66 = (byte)uVar31;
      auVar67 = vpermilpd_avx(auVar69,1);
      iVar26 = (int)((double)((ulong)(bVar66 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x14);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x14);
      if (((iVar33 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar16 || (iVar27 = iVar1 + iVar26, iimage->width < iVar27)))) {
        haarXY(iimage,iVar33,iVar26,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar46 = iVar26 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar28 = iimage->data_width;
        iVar29 = iVar28 * iVar17;
        fVar80 = pfVar58[iVar28 * iVar18 + -1 + iVar26];
        iVar45 = iVar28 * (iVar1 + -1 + iVar33);
        fVar86 = pfVar58[iVar45 + -1 + iVar26];
        fVar90 = pfVar58[iVar45 + -1 + iVar27];
        fVar102 = pfVar58[iVar29 + -1 + iVar26];
        fVar87 = pfVar58[iVar29 + -1 + iVar27];
        fVar5 = pfVar58[iVar28 * iVar18 + -1 + iVar27];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar29 + iVar46] - pfVar58[iVar45 + iVar46]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      auVar67 = vmovshdup_avx(auVar69);
      iVar27 = (int)((double)((ulong)(bVar66 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x18);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x18);
      if ((((iVar33 < 1) || (iVar27 < 1)) || (iimage->height < iVar16)) ||
         (iVar28 = iVar1 + iVar27, iimage->width < iVar28)) {
        haarXY(iimage,iVar33,iVar27,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar45 = iVar27 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar29 = iimage->data_width;
        iVar46 = iVar29 * iVar17;
        fVar80 = pfVar58[iVar29 * iVar18 + -1 + iVar27];
        iVar44 = iVar29 * (iVar1 + -1 + iVar33);
        fVar86 = pfVar58[iVar44 + -1 + iVar27];
        fVar90 = pfVar58[iVar44 + -1 + iVar28];
        fVar102 = pfVar58[iVar46 + -1 + iVar27];
        fVar87 = pfVar58[iVar46 + -1 + iVar28];
        fVar5 = pfVar58[iVar29 * iVar18 + -1 + iVar28];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar46 + iVar45] - pfVar58[iVar44 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      local_138 = auVar69._0_4_;
      iVar28 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) + (double)local_138);
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x1c);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x1c);
      if (((iVar33 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar16 || (iVar29 = iVar1 + iVar28, iimage->width < iVar29)))) {
        haarXY(iimage,iVar33,iVar28,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar44 = iVar28 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar46 = iimage->data_width;
        iVar45 = iVar46 * iVar17;
        fVar80 = pfVar58[iVar46 * iVar18 + -1 + iVar28];
        iVar43 = iVar46 * (iVar1 + -1 + iVar33);
        fVar86 = pfVar58[iVar43 + -1 + iVar28];
        fVar90 = pfVar58[iVar43 + -1 + iVar29];
        fVar102 = pfVar58[iVar45 + -1 + iVar28];
        fVar87 = pfVar58[iVar45 + -1 + iVar29];
        fVar5 = pfVar58[iVar46 * iVar18 + -1 + iVar29];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar45 + iVar44] - pfVar58[iVar43 + iVar44]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x60);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x60);
      if (((iVar60 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar19 || (iVar29 = iVar1 + iVar34, iimage->width < iVar29)))) {
        haarXY(iimage,iVar60,iVar34,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar45 = iVar34 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar46 = iimage->data_width;
        iVar43 = iVar46 * iVar20;
        fVar80 = pfVar58[iVar46 * iVar21 + -1 + iVar34];
        iVar44 = iVar46 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar44 + -1 + iVar34];
        fVar90 = pfVar58[iVar44 + -1 + iVar29];
        fVar102 = pfVar58[iVar43 + -1 + iVar34];
        fVar87 = pfVar58[iVar43 + -1 + iVar29];
        fVar5 = pfVar58[iVar46 * iVar21 + -1 + iVar29];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar43 + iVar45] - pfVar58[iVar44 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 100);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 100);
      if ((((iVar60 < 1) || (iVar22 < 1)) || (iimage->height < iVar19)) ||
         (iVar34 = iVar1 + iVar22, iimage->width < iVar34)) {
        haarXY(iimage,iVar60,iVar22,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar46 = iVar22 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar29 = iimage->data_width;
        iVar44 = iVar29 * iVar20;
        fVar80 = pfVar58[iVar29 * iVar21 + -1 + iVar22];
        iVar45 = iVar29 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar45 + -1 + iVar22];
        fVar90 = pfVar58[iVar45 + -1 + iVar34];
        fVar102 = pfVar58[iVar44 + -1 + iVar22];
        fVar87 = pfVar58[iVar44 + -1 + iVar34];
        fVar5 = pfVar58[iVar29 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar44 + iVar46] - pfVar58[iVar45 + iVar46]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x68);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x68);
      if (((iVar60 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar1 + iVar23, iimage->width < iVar34)))) {
        haarXY(iimage,iVar60,iVar23,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar29 = iVar23 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar45 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar23];
        iVar46 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar46 + -1 + iVar23];
        fVar90 = pfVar58[iVar46 + -1 + iVar34];
        fVar102 = pfVar58[iVar45 + -1 + iVar23];
        fVar87 = pfVar58[iVar45 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar45 + iVar29] - pfVar58[iVar46 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x6c);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x6c);
      if (((iVar60 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar1 + iVar24, iimage->width < iVar34)))) {
        haarXY(iimage,iVar60,iVar24,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar23 = iVar24 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar46 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar24];
        iVar29 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar29 + -1 + iVar24];
        fVar90 = pfVar58[iVar29 + -1 + iVar34];
        fVar102 = pfVar58[iVar46 + -1 + iVar24];
        fVar87 = pfVar58[iVar46 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar46 + iVar23] - pfVar58[iVar29 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x70);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x70);
      if ((((iVar60 < 1) || (iVar25 < 1)) || (iimage->height < iVar19)) ||
         (iVar34 = iVar1 + iVar25, iimage->width < iVar34)) {
        haarXY(iimage,iVar60,iVar25,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar23 = iVar25 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar29 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar25];
        iVar24 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar24 + -1 + iVar25];
        fVar90 = pfVar58[iVar24 + -1 + iVar34];
        fVar102 = pfVar58[iVar29 + -1 + iVar25];
        fVar87 = pfVar58[iVar29 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar29 + iVar23] - pfVar58[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x74);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x74);
      if (((iVar60 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar1 + iVar26, iimage->width < iVar34)))) {
        haarXY(iimage,iVar60,iVar26,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar23 = iVar26 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar26];
        iVar24 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar24 + -1 + iVar26];
        fVar90 = pfVar58[iVar24 + -1 + iVar34];
        fVar102 = pfVar58[iVar25 + -1 + iVar26];
        fVar87 = pfVar58[iVar25 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar25 + iVar23] - pfVar58[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x78);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x78);
      if (((iVar60 < 1) || (iVar27 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar1 + iVar27, iimage->width < iVar34)))) {
        haarXY(iimage,iVar60,iVar27,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar23 = iVar27 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar27];
        iVar24 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar24 + -1 + iVar27];
        fVar90 = pfVar58[iVar24 + -1 + iVar34];
        fVar102 = pfVar58[iVar25 + -1 + iVar27];
        fVar87 = pfVar58[iVar25 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar25 + iVar23] - pfVar58[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar63 + 0x7c);
      pfVar65 = (float *)((long)haarResponseY + lVar63 + 0x7c);
      if ((((iVar60 < 1) || (iVar28 < 1)) || (iimage->height < iVar19)) ||
         (iVar34 = iVar1 + iVar28, iimage->width < iVar34)) {
        haarXY(iimage,iVar60,iVar28,iVar38,pfVar52,pfVar65);
      }
      else {
        iVar23 = iVar28 + -1 + iVar38;
        pfVar58 = iimage->data;
        iVar22 = iimage->data_width;
        iVar25 = iVar22 * iVar20;
        fVar80 = pfVar58[iVar22 * iVar21 + -1 + iVar28];
        iVar24 = iVar22 * (iVar1 + -1 + iVar60);
        fVar86 = pfVar58[iVar24 + -1 + iVar28];
        fVar90 = pfVar58[iVar24 + -1 + iVar34];
        fVar102 = pfVar58[iVar25 + -1 + iVar28];
        fVar87 = pfVar58[iVar25 + -1 + iVar34];
        fVar5 = pfVar58[iVar22 * iVar21 + -1 + iVar34];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar25 + iVar23] - pfVar58[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar52 = (fVar86 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar90 - fVar102)));
        *pfVar65 = auVar67._0_4_ - (fVar86 - fVar87);
      }
      auVar111 = ZEXT1664(auVar68);
      lVar63 = lVar63 + 0x20;
      bVar2 = iVar36 < 4;
      iVar36 = iVar36 + 8;
    } while (bVar2);
    lVar64 = lVar64 + 0xc0;
    bVar2 = (int)uVar30 < 10;
    uVar30 = uVar30 + 2;
  } while (bVar2);
LAB_001c93d7:
  fVar81 = auVar111._0_4_;
  auVar110._8_4_ = 0x3effffff;
  auVar110._0_8_ = 0x3effffff3effffff;
  auVar110._12_4_ = 0x3effffff;
  auVar109._8_4_ = 0x80000000;
  auVar109._0_8_ = 0x8000000080000000;
  auVar109._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 0.5)),auVar109,0xf8);
  auVar67 = ZEXT416((uint)(fVar81 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 1.5)),auVar109,0xf8);
  auVar68 = ZEXT416((uint)(fVar81 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 2.5)),auVar109,0xf8);
  auVar70 = ZEXT416((uint)(fVar81 * 2.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar69 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 3.5)),auVar109,0xf8);
  auVar69 = ZEXT416((uint)(fVar81 * 3.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar71 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 4.5)),auVar109,0xf8);
  auVar71 = ZEXT416((uint)(fVar81 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 5.5)),auVar109,0xf8);
  auVar72 = ZEXT416((uint)(fVar81 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 6.5)),auVar109,0xf8);
  auVar73 = ZEXT416((uint)(fVar81 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 7.5)),auVar109,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar81 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 8.5)),auVar109,0xf8);
  auVar75 = ZEXT416((uint)(fVar81 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 9.5)),auVar109,0xf8);
  auVar76 = ZEXT416((uint)(fVar81 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 10.5)),auVar109,0xf8);
  auVar77 = ZEXT416((uint)(fVar81 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar81 * 11.5)),auVar109,0xf8);
  auVar78 = ZEXT416((uint)(fVar81 * 11.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  fVar87 = auVar70._0_4_;
  fVar81 = fVar87 + auVar68._0_4_;
  fVar3 = fVar87 + auVar67._0_4_;
  fVar4 = fVar87 - auVar67._0_4_;
  fVar80 = fVar87 - auVar68._0_4_;
  fVar86 = fVar87 - auVar69._0_4_;
  fVar90 = fVar87 - auVar71._0_4_;
  fVar102 = fVar87 - auVar72._0_4_;
  fVar87 = fVar87 - auVar73._0_4_;
  fVar107 = auVar74._0_4_;
  fVar5 = fVar107 - auVar69._0_4_;
  fVar6 = fVar107 - auVar71._0_4_;
  fVar7 = fVar107 - auVar72._0_4_;
  fVar8 = fVar107 - auVar73._0_4_;
  fVar9 = fVar107 - auVar75._0_4_;
  fVar10 = fVar107 - auVar76._0_4_;
  fVar11 = fVar107 - auVar77._0_4_;
  fVar107 = fVar107 - auVar78._0_4_;
  gauss_s1_c0[0] = expf(fVar81 * fVar81 * fVar79);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar79);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar79);
  gauss_s1_c0[3] = expf(fVar80 * fVar80 * fVar79);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar86 * fVar86 * fVar79);
  gauss_s1_c0[6] = expf(fVar90 * fVar90 * fVar79);
  gauss_s1_c0[7] = expf(fVar102 * fVar102 * fVar79);
  gauss_s1_c0[8] = expf(fVar87 * fVar87 * fVar79);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar79);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar79);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar79);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar79);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar79);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar79);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar79);
  gauss_s1_c1[8] = expf(fVar107 * fVar107 * fVar79);
  uVar31 = 0xfffffff8;
  lVar64 = 0;
  fVar81 = 0.0;
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  lVar63 = 0;
  lVar53 = 0;
  do {
    pfVar52 = gauss_s1_c1;
    uVar30 = (uint)uVar31;
    if (uVar30 != 7) {
      pfVar52 = gauss_s1_c0;
    }
    if (uVar30 == 0xfffffff8) {
      pfVar52 = gauss_s1_c1;
    }
    lVar63 = (long)(int)lVar63;
    iVar38 = (int)lVar53;
    lVar53 = (long)iVar38;
    lVar50 = (long)haarResponseX + lVar64;
    lVar37 = (long)haarResponseY + lVar64;
    uVar47 = 0xfffffff8;
    uVar39 = 0;
    do {
      pfVar65 = gauss_s1_c1;
      if (uVar47 != 7) {
        pfVar65 = gauss_s1_c0;
      }
      if (uVar47 == 0xfffffff8) {
        pfVar65 = gauss_s1_c1;
      }
      uVar32 = (ulong)(uVar47 >> 0x1c & 0xfffffff8);
      auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar35 = uVar39;
      lVar59 = lVar50;
      lVar61 = lVar37;
      do {
        lVar54 = 0;
        pfVar58 = (float *)((long)pfVar52 + (ulong)(uint)((int)(uVar31 >> 0x1f) << 5));
        do {
          fVar3 = pfVar65[uVar32] * *pfVar58;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar61 + lVar54 * 4)),
                                  ZEXT416(*(uint *)(lVar59 + lVar54 * 4)),0x10);
          auVar100._0_4_ = fVar3 * auVar67._0_4_;
          auVar100._4_4_ = fVar3 * auVar67._4_4_;
          auVar100._8_4_ = fVar3 * auVar67._8_4_;
          auVar100._12_4_ = fVar3 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar100,auVar85);
          auVar67 = vmovlhps_avx(auVar100,auVar67);
          auVar89._0_4_ = auVar105._0_4_ + auVar67._0_4_;
          auVar89._4_4_ = auVar105._4_4_ + auVar67._4_4_;
          auVar89._8_4_ = auVar105._8_4_ + auVar67._8_4_;
          auVar89._12_4_ = auVar105._12_4_ + auVar67._12_4_;
          auVar105 = ZEXT1664(auVar89);
          pfVar58 = pfVar58 + (ulong)(~uVar30 >> 0x1f) * 2 + -1;
          lVar54 = lVar54 + 1;
        } while (lVar54 != 9);
        uVar35 = uVar35 + 0x18;
        uVar32 = uVar32 + (ulong)(-1 < (int)uVar47) * 2 + -1;
        lVar59 = lVar59 + 0x60;
        lVar61 = lVar61 + 0x60;
      } while (uVar35 < uVar47 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar53];
      auVar13._4_4_ = fVar3;
      auVar13._0_4_ = fVar3;
      auVar13._8_4_ = fVar3;
      auVar13._12_4_ = fVar3;
      auVar70 = vmulps_avx512vl(auVar89,auVar13);
      lVar53 = lVar53 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar63) = auVar70;
      auVar92._0_4_ = auVar70._0_4_ * auVar70._0_4_;
      auVar92._4_4_ = auVar70._4_4_ * auVar70._4_4_;
      auVar92._8_4_ = auVar70._8_4_ * auVar70._8_4_;
      auVar92._12_4_ = auVar70._12_4_ * auVar70._12_4_;
      auVar67 = vmovshdup_avx(auVar92);
      auVar68 = vfmadd231ss_fma(auVar67,auVar70,auVar70);
      auVar67 = vshufpd_avx(auVar70,auVar70,1);
      auVar68 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      auVar67 = vshufps_avx(auVar70,auVar70,0xff);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar81 = fVar81 + auVar67._0_4_;
      lVar63 = lVar63 + 4;
      uVar47 = uVar47 + 5;
      uVar39 = uVar39 + 0x78;
      lVar50 = lVar50 + 0x1e0;
      lVar37 = lVar37 + 0x1e0;
    } while (iVar38 + 4 != (int)lVar53);
    lVar64 = lVar64 + 0x14;
    uVar31 = (ulong)(uVar30 + 5);
  } while ((int)uVar30 < 3);
  if (fVar81 < 0.0) {
    fVar81 = sqrtf(fVar81);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81));
    fVar81 = auVar67._0_4_;
  }
  auVar105 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar81)));
  lVar64 = 0;
  do {
    auVar108 = vmulps_avx512f(auVar105,*(undefined1 (*) [64])(ipoint->descriptor + lVar64));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar64) = auVar108;
    lVar64 = lVar64 + 0x10;
  } while (lVar64 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_8_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}